

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

string * __thiscall
google::protobuf::internal::WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::
MakeInvalidEmbeddedMessage_abi_cxx11_
          (string *__return_storage_ptr__,
          WireFormatInvalidInputTest<proto2_unittest::TestAllTypes> *this,char *bytes,int size)

{
  char *pcVar1;
  int field_number;
  Descriptor *this_00;
  LogMessage *pLVar2;
  ulong uVar3;
  allocator local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  CodedOutputStream output;
  undefined1 local_70 [8];
  StringOutputStream raw_output;
  LogMessage local_58;
  Voidify local_41;
  string_view local_40;
  FieldDescriptor *local_30;
  FieldDescriptor *field;
  char *pcStack_20;
  int size_local;
  char *bytes_local;
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes> *this_local;
  string *result;
  
  field._4_4_ = size;
  pcStack_20 = bytes;
  bytes_local = (char *)this;
  this_local = (WireFormatInvalidInputTest<proto2_unittest::TestAllTypes> *)__return_storage_ptr__;
  this_00 = proto2_unittest::TestAllTypes::descriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"optional_nested_message");
  local_30 = Descriptor::FindFieldByName(this_00,local_40);
  raw_output.target_._7_1_ = 0;
  if (local_30 == (FieldDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x52c,"field != nullptr");
    raw_output.target_._7_1_ = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar2);
  }
  if ((raw_output.target_._7_1_ & 1) == 0) {
    raw_output.target_._6_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    protobuf::io::StringOutputStream::StringOutputStream
              ((StringOutputStream *)local_70,__return_storage_ptr__);
    protobuf::io::CodedOutputStream::
    CodedOutputStream<google::protobuf::io::StringOutputStream,void>
              ((CodedOutputStream *)local_d0,(StringOutputStream *)local_70);
    field_number = FieldDescriptor::number(local_30);
    pcVar1 = pcStack_20;
    uVar3 = (ulong)field._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,pcVar1,uVar3,&local_f1);
    WireFormatLite::WriteBytes(field_number,&local_f0,(CodedOutputStream *)local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    protobuf::io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_d0);
    protobuf::io::StringOutputStream::~StringOutputStream((StringOutputStream *)local_70);
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

std::string MakeInvalidEmbeddedMessage(const char* bytes, int size) {
    const FieldDescriptor* field =
        TestAllTypes::descriptor()->FindFieldByName("optional_nested_message");
    ABSL_CHECK(field != nullptr);

    std::string result;

    {
      io::StringOutputStream raw_output(&result);
      io::CodedOutputStream output(&raw_output);

      WireFormatLite::WriteBytes(field->number(), std::string(bytes, size),
                                 &output);
    }

    return result;
  }